

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImFont::RenderText(ImFont *this,ImDrawList *draw_list,float size,ImVec2 pos,ImU32 col,
                  ImVec4 *clip_rect,char *text_begin,char *text_end,float wrap_width,
                  _Bool cpu_fine_clip)

{
  uint *puVar1;
  char cVar2;
  ushort uVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  wchar_t wVar7;
  size_t sVar8;
  void *pvVar9;
  char *pcVar10;
  long lVar11;
  char *pcVar12;
  ImFontGlyph *pIVar13;
  ImDrawIdx IVar14;
  char *text_end_00;
  char *pcVar15;
  char *in_text;
  float scale;
  float fVar16;
  float in_XMM1_Dc;
  float fVar17;
  float in_XMM1_Dd;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  uint c;
  uint local_90;
  ImU32 local_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  ulong local_60;
  ImDrawIdx *local_58;
  ImDrawVert *local_50;
  uint local_44;
  int local_40;
  wchar_t local_3c;
  char *local_38;
  
  local_78._0_4_ = pos.x;
  local_78._4_4_ = pos.y;
  local_8c = col;
  if (text_end == (char *)0x0) {
    fStack_70 = in_XMM1_Dc;
    local_78 = (undefined1  [8])pos;
    fStack_6c = in_XMM1_Dd;
    sVar8 = strlen(text_begin);
    text_end = text_begin + sVar8;
    in_XMM1_Dc = fStack_70;
    in_XMM1_Dd = fStack_6c;
  }
  local_88 = (float)(int)(float)local_78._4_4_;
  fVar20 = (float)(int)(float)local_78._4_4_;
  fVar21 = (float)(int)(float)local_78._4_4_;
  fVar22 = (float)(int)(float)local_78._4_4_;
  fVar29 = clip_rect->w;
  if (local_88 <= fVar29) {
    scale = size / this->FontSize;
    fVar18 = this->FontSize * scale;
    fStack_70 = in_XMM1_Dc;
    fStack_6c = in_XMM1_Dd;
    fStack_84 = fVar20;
    fStack_80 = fVar21;
    fStack_7c = fVar22;
    if (wrap_width <= 0.0) {
      fVar16 = local_88 + fVar18;
      fVar17 = clip_rect->y;
      if ((fVar16 < fVar17) && (text_begin < text_end && fVar16 < fVar17)) {
        do {
          local_88 = fVar16;
          fStack_84 = fVar20;
          fStack_80 = fVar21;
          fStack_7c = fVar22;
          pvVar9 = memchr(text_begin,10,(long)text_end - (long)text_begin);
          text_begin = (char *)((long)pvVar9 + 1);
          if (pvVar9 == (void *)0x0) {
            text_begin = text_end;
          }
          fVar20 = 0.0;
          fVar21 = 0.0;
          fVar22 = 0.0;
          fVar16 = fVar18 + local_88;
        } while ((fVar16 < fVar17) && (text_begin < text_end));
      }
    }
    text_end_00 = text_end;
    if ((wrap_width <= 0.0) &&
       (pcVar10 = text_begin, fVar20 = local_88, 10000 < (long)text_end - (long)text_begin)) {
      while ((text_end_00 = pcVar10, fVar20 < fVar29 && (pcVar10 < text_end))) {
        pvVar9 = memchr(pcVar10,10,(long)text_end - (long)pcVar10);
        pcVar10 = (char *)((long)pvVar9 + 1);
        if (pvVar9 == (void *)0x0) {
          pcVar10 = text_end;
        }
        fVar20 = fVar20 + fVar18;
      }
    }
    if (text_begin != text_end_00) {
      local_78._4_4_ = (float)(int)(float)local_78._4_4_;
      local_78._0_4_ = (float)(int)(float)local_78._0_4_;
      fStack_70 = (float)(int)fStack_70;
      fStack_6c = (float)(int)fStack_6c;
      iVar6 = (int)text_end_00 - (int)text_begin;
      local_40 = iVar6 * 6;
      local_3c = (draw_list->IdxBuffer).Size;
      ImDrawList::PrimReserve(draw_list,local_40,iVar6 * 4);
      local_50 = draw_list->_VtxWritePtr;
      local_58 = draw_list->_IdxWritePtr;
      local_60 = (ulong)draw_list->_VtxCurrentIdx;
      local_44 = local_8c | 0xffffff;
      pcVar12 = (char *)0x0;
      pcVar10 = pcVar12;
      fVar29 = (float)local_78._0_4_;
      fVar20 = (float)local_78._0_4_;
      fVar21 = local_88;
      fVar22 = fStack_84;
      fVar17 = fStack_80;
      fVar16 = fStack_7c;
      fVar23 = (float)local_78._0_4_;
      pcVar15 = text_begin;
joined_r0x0020a4a8:
      do {
        if (text_end_00 <= text_begin) break;
        in_text = pcVar15;
        fVar19 = fVar23;
        fVar27 = local_88;
        fVar26 = fStack_84;
        fVar24 = fStack_80;
        fVar25 = fStack_7c;
        local_38 = pcVar12;
        if (0.0 < wrap_width) {
          if (pcVar10 == (char *)0x0) {
            pcVar10 = CalcWordWrapPositionA
                                (this,scale,text_begin,text_end_00,(fVar20 - fVar29) + wrap_width);
            fVar22 = 0.0;
            fVar17 = 0.0;
            fVar16 = 0.0;
            pcVar10 = pcVar10 + (pcVar10 == text_begin);
            fVar20 = (float)local_78._0_4_;
          }
          pcVar12 = pcVar10;
          in_text = text_begin;
          fVar19 = fVar29;
          fVar27 = fVar21;
          fVar26 = fVar22;
          fVar24 = fVar17;
          fVar25 = fVar16;
          if (pcVar10 <= text_begin) {
            do {
              if (text_end_00 <= text_begin) break;
              cVar2 = *text_begin;
              text_begin = text_begin + ((byte)(cVar2 - 9U) < 2 || cVar2 == ' ');
            } while ((cVar2 == ' ') || (cVar2 == '\t'));
            pcVar10 = (char *)0x0;
            pcVar12 = local_38;
            fVar29 = fVar20;
            fVar21 = fVar21 + fVar18;
            goto joined_r0x0020a4a8;
          }
        }
        fStack_7c = fVar25;
        fStack_80 = fVar24;
        fStack_84 = fVar26;
        local_88 = fVar27;
        local_90 = (uint)*in_text;
        if (*in_text < '\0') {
          iVar6 = ImTextCharFromUtf8(&local_90,in_text,text_end_00);
          text_begin = in_text + iVar6;
          fVar20 = (float)local_78._0_4_;
          if (local_90 != 0) goto LAB_0020a5f7;
          bVar4 = true;
        }
        else {
          text_begin = in_text + 1;
LAB_0020a5f7:
          if (local_90 < 0x20) {
            if (local_90 != 0xd) {
              if (local_90 == 10) {
                local_88 = local_88 + fVar18;
                bVar4 = clip_rect->w <= local_88 && local_88 != clip_rect->w;
                fVar19 = fVar20;
                goto LAB_0020a8fa;
              }
              goto LAB_0020a630;
            }
          }
          else {
LAB_0020a630:
            if (((local_90 & 0xffff) < (uint)(this->IndexLookup).Size) &&
               (uVar3 = (this->IndexLookup).Data[(ushort)local_90], uVar3 != 0xffff)) {
              pIVar13 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar3 * 0x28);
            }
            else {
              pIVar13 = this->FallbackGlyph;
            }
            if (pIVar13 != (ImFontGlyph *)0x0) {
              fVar29 = pIVar13->AdvanceX * scale;
              if (((undefined1  [40])*pIVar13 & (undefined1  [40])0x2) != (undefined1  [40])0x0) {
                fVar22 = pIVar13->X0 * scale + fVar19;
                fVar21 = clip_rect->z;
                bVar4 = true;
                if (fVar22 <= fVar21) {
                  fVar16 = pIVar13->X1 * scale + fVar19;
                  fVar17 = clip_rect->x;
                  if (fVar17 <= fVar16) {
                    fVar28 = pIVar13->Y0 * scale + local_88;
                    fVar25 = pIVar13->Y1 * scale + local_88;
                    fVar23 = pIVar13->U0;
                    fVar27 = pIVar13->V0;
                    fVar26 = pIVar13->U1;
                    fVar24 = pIVar13->V1;
                    if (cpu_fine_clip) {
                      if (fVar22 < fVar17) {
                        fVar23 = fVar23 + (fVar26 - fVar23) *
                                          (1.0 - (fVar16 - fVar17) / (fVar16 - fVar22));
                        fVar22 = fVar17;
                      }
                      fVar17 = clip_rect->y;
                      if (fVar28 < fVar17) {
                        fVar27 = fVar27 + (fVar24 - fVar27) *
                                          (1.0 - (fVar25 - fVar17) / (fVar25 - fVar28));
                        fVar28 = fVar17;
                      }
                      if (fVar21 < fVar16) {
                        fVar26 = (fVar26 - fVar23) * ((fVar21 - fVar22) / (fVar16 - fVar22)) +
                                 fVar23;
                        fVar16 = fVar21;
                      }
                      fVar21 = clip_rect->w;
                      if (fVar21 < fVar25) {
                        fVar24 = (fVar24 - fVar27) * ((fVar21 - fVar28) / (fVar25 - fVar28)) +
                                 fVar27;
                        fVar25 = fVar21;
                      }
                      if (fVar25 <= fVar28) {
                        fVar19 = fVar19 + fVar29;
                        bVar4 = false;
                        goto LAB_0020a8ef;
                      }
                    }
                    uVar5 = local_44;
                    if (((undefined1  [40])*pIVar13 & (undefined1  [40])0x1) ==
                        (undefined1  [40])0x0) {
                      uVar5 = local_8c;
                    }
                    IVar14 = (ImDrawIdx)local_60;
                    *local_58 = IVar14;
                    local_58[1] = IVar14 + 1;
                    local_58[2] = IVar14 + 2;
                    local_58[3] = IVar14;
                    local_58[4] = IVar14 + 2;
                    local_58[5] = IVar14 + 3;
                    (local_50->pos).x = fVar22;
                    (local_50->pos).y = fVar28;
                    local_50->col = uVar5;
                    (local_50->uv).x = fVar23;
                    (local_50->uv).y = fVar27;
                    local_50[1].pos.x = fVar16;
                    local_50[1].pos.y = fVar28;
                    local_50[1].col = uVar5;
                    local_50[1].uv.x = fVar26;
                    local_50[1].uv.y = fVar27;
                    local_50[2].pos.x = fVar16;
                    local_50[2].pos.y = fVar25;
                    local_50[2].col = uVar5;
                    local_50[2].uv.x = fVar26;
                    local_50[2].uv.y = fVar24;
                    local_50[3].pos.x = fVar22;
                    local_50[3].pos.y = fVar25;
                    local_50[3].col = uVar5;
                    local_50[3].uv.x = fVar23;
                    local_50[3].uv.y = fVar24;
                    local_50 = local_50 + 4;
                    local_60 = (ulong)((int)local_60 + 4);
                    local_58 = local_58 + 6;
                  }
                }
LAB_0020a8ef:
                if (!bVar4) goto LAB_0020a8f8;
              }
              fVar19 = fVar19 + fVar29;
            }
          }
LAB_0020a8f8:
          bVar4 = false;
        }
LAB_0020a8fa:
        pcVar10 = pcVar12;
        fVar29 = fVar19;
        fVar21 = local_88;
        fVar22 = fStack_84;
        fVar17 = fStack_80;
        fVar16 = fStack_7c;
        fVar23 = fVar19;
        pcVar15 = text_begin;
      } while (!bVar4);
      (draw_list->VtxBuffer).Size =
           (int)((ulong)((long)local_50 - (long)(draw_list->VtxBuffer).Data) >> 2) * -0x33333333;
      wVar7 = (wchar_t)((ulong)((long)local_58 - (long)(draw_list->IdxBuffer).Data) >> 1);
      (draw_list->IdxBuffer).Size = wVar7;
      lVar11 = (long)(draw_list->CmdBuffer).Size;
      if (lVar11 < 1) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                      ,0x706,"T &ImVector<ImDrawCmd>::operator[](int) [T = ImDrawCmd]");
      }
      puVar1 = &(draw_list->CmdBuffer).Data[lVar11 + -1].ElemCount;
      *puVar1 = *puVar1 + (wVar7 - (local_3c + local_40));
      draw_list->_VtxWritePtr = local_50;
      draw_list->_IdxWritePtr = local_58;
      draw_list->_VtxCurrentIdx = (uint)local_60;
    }
  }
  return;
}

Assistant:

void ImFont::RenderText(ImDrawList* draw_list, float size, ImVec2 pos, ImU32 col, const ImVec4& clip_rect, const char* text_begin, const char* text_end, float wrap_width, bool cpu_fine_clip) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // ImGui:: functions generally already provides a valid text_end, so this is merely to handle direct calls.

    // Align to be pixel perfect
    pos.x = IM_FLOOR(pos.x);
    pos.y = IM_FLOOR(pos.y);
    float x = pos.x;
    float y = pos.y;
    if (y > clip_rect.w)
        return;

    const float scale = size / FontSize;
    const float line_height = FontSize * scale;
    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    // Fast-forward to first visible line
    const char* s = text_begin;
    if (y + line_height < clip_rect.y && !word_wrap_enabled)
        while (y + line_height < clip_rect.y && s < text_end)
        {
            s = (const char*)memchr(s, '\n', text_end - s);
            s = s ? s + 1 : text_end;
            y += line_height;
        }

    // For large text, scan for the last visible line in order to avoid over-reserving in the call to PrimReserve()
    // Note that very large horizontal line will still be affected by the issue (e.g. a one megabyte string buffer without a newline will likely crash atm)
    if (text_end - s > 10000 && !word_wrap_enabled)
    {
        const char* s_end = s;
        float y_end = y;
        while (y_end < clip_rect.w && s_end < text_end)
        {
            s_end = (const char*)memchr(s_end, '\n', text_end - s_end);
            s_end = s_end ? s_end + 1 : text_end;
            y_end += line_height;
        }
        text_end = s_end;
    }
    if (s == text_end)
        return;

    // Reserve vertices for remaining worse case (over-reserving is useful and easily amortized)
    const int vtx_count_max = (int)(text_end - s) * 4;
    const int idx_count_max = (int)(text_end - s) * 6;
    const int idx_expected_size = draw_list->IdxBuffer.Size + idx_count_max;
    draw_list->PrimReserve(idx_count_max, vtx_count_max);

    ImDrawVert* vtx_write = draw_list->_VtxWritePtr;
    ImDrawIdx* idx_write = draw_list->_IdxWritePtr;
    unsigned int vtx_current_idx = draw_list->_VtxCurrentIdx;

    const ImU32 col_untinted = col | ~IM_COL32_A_MASK;

    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
            {
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - (x - pos.x));
                if (word_wrap_eol == s) // Wrap_width is too small to fit anything. Force displaying 1 character to minimize the height discontinuity.
                    word_wrap_eol++;    // +1 may not be a character start point in UTF-8 but it's ok because we use s >= word_wrap_eol below
            }

            if (s >= word_wrap_eol)
            {
                x = pos.x;
                y += line_height;
                word_wrap_eol = NULL;

                // Wrapping skips upcoming blanks
                while (s < text_end)
                {
                    const char c = *s;
                    if (ImCharIsBlankA(c)) { s++; } else if (c == '\n') { s++; break; } else { break; }
                }
                continue;
            }
        }

        // Decode and advance source
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0) // Malformed UTF-8?
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                x = pos.x;
                y += line_height;
                if (y > clip_rect.w)
                    break; // break out of main loop
                continue;
            }
            if (c == '\r')
                continue;
        }

        const ImFontGlyph* glyph = FindGlyph((ImWchar)c);
        if (glyph == NULL)
            continue;

        float char_width = glyph->AdvanceX * scale;
        if (glyph->Visible)
        {
            // We don't do a second finer clipping test on the Y axis as we've already skipped anything before clip_rect.y and exit once we pass clip_rect.w
            float x1 = x + glyph->X0 * scale;
            float x2 = x + glyph->X1 * scale;
            float y1 = y + glyph->Y0 * scale;
            float y2 = y + glyph->Y1 * scale;
            if (x1 <= clip_rect.z && x2 >= clip_rect.x)
            {
                // Render a character
                float u1 = glyph->U0;
                float v1 = glyph->V0;
                float u2 = glyph->U1;
                float v2 = glyph->V1;

                // CPU side clipping used to fit text in their frame when the frame is too small. Only does clipping for axis aligned quads.
                if (cpu_fine_clip)
                {
                    if (x1 < clip_rect.x)
                    {
                        u1 = u1 + (1.0f - (x2 - clip_rect.x) / (x2 - x1)) * (u2 - u1);
                        x1 = clip_rect.x;
                    }
                    if (y1 < clip_rect.y)
                    {
                        v1 = v1 + (1.0f - (y2 - clip_rect.y) / (y2 - y1)) * (v2 - v1);
                        y1 = clip_rect.y;
                    }
                    if (x2 > clip_rect.z)
                    {
                        u2 = u1 + ((clip_rect.z - x1) / (x2 - x1)) * (u2 - u1);
                        x2 = clip_rect.z;
                    }
                    if (y2 > clip_rect.w)
                    {
                        v2 = v1 + ((clip_rect.w - y1) / (y2 - y1)) * (v2 - v1);
                        y2 = clip_rect.w;
                    }
                    if (y1 >= y2)
                    {
                        x += char_width;
                        continue;
                    }
                }

                // Support for untinted glyphs
                ImU32 glyph_col = glyph->Colored ? col_untinted : col;

                // We are NOT calling PrimRectUV() here because non-inlined causes too much overhead in a debug builds. Inlined here:
                {
                    idx_write[0] = (ImDrawIdx)(vtx_current_idx); idx_write[1] = (ImDrawIdx)(vtx_current_idx+1); idx_write[2] = (ImDrawIdx)(vtx_current_idx+2);
                    idx_write[3] = (ImDrawIdx)(vtx_current_idx); idx_write[4] = (ImDrawIdx)(vtx_current_idx+2); idx_write[5] = (ImDrawIdx)(vtx_current_idx+3);
                    vtx_write[0].pos.x = x1; vtx_write[0].pos.y = y1; vtx_write[0].col = glyph_col; vtx_write[0].uv.x = u1; vtx_write[0].uv.y = v1;
                    vtx_write[1].pos.x = x2; vtx_write[1].pos.y = y1; vtx_write[1].col = glyph_col; vtx_write[1].uv.x = u2; vtx_write[1].uv.y = v1;
                    vtx_write[2].pos.x = x2; vtx_write[2].pos.y = y2; vtx_write[2].col = glyph_col; vtx_write[2].uv.x = u2; vtx_write[2].uv.y = v2;
                    vtx_write[3].pos.x = x1; vtx_write[3].pos.y = y2; vtx_write[3].col = glyph_col; vtx_write[3].uv.x = u1; vtx_write[3].uv.y = v2;
                    vtx_write += 4;
                    vtx_current_idx += 4;
                    idx_write += 6;
                }
            }
        }
        x += char_width;
    }

    // Give back unused vertices (clipped ones, blanks) ~ this is essentially a PrimUnreserve() action.
    draw_list->VtxBuffer.Size = (int)(vtx_write - draw_list->VtxBuffer.Data); // Same as calling shrink()
    draw_list->IdxBuffer.Size = (int)(idx_write - draw_list->IdxBuffer.Data);
    draw_list->CmdBuffer[draw_list->CmdBuffer.Size - 1].ElemCount -= (idx_expected_size - draw_list->IdxBuffer.Size);
    draw_list->_VtxWritePtr = vtx_write;
    draw_list->_IdxWritePtr = idx_write;
    draw_list->_VtxCurrentIdx = vtx_current_idx;
}